

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void do_reflect(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
               jvirt_barray_ptr *src_coef_arrays,JDIMENSION drop_width,JDIMENSION drop_height)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long in_RCX;
  short *psVar6;
  int in_EDX;
  short *psVar7;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  jpeg_component_info *compptr;
  JCOEFPTR dst_ptr;
  JCOEFPTR src_ptr;
  JBLOCKROW dst_row_ptr;
  JBLOCKROW src_row_ptr;
  JBLOCKARRAY buffer;
  int offset_y;
  int k;
  int ci;
  JDIMENSION dst_blk_x;
  JDIMENSION src_blk_x;
  JDIMENSION wipe_bottom;
  JDIMENSION y_wipe_blocks;
  JDIMENSION wipe_width;
  JDIMENSION x_wipe_blocks;
  undefined2 *local_78;
  undefined2 *local_70;
  undefined2 *local_68;
  undefined2 *local_60;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  uint local_34;
  
  for (local_44 = 0; local_44 < *(int *)(in_RSI + 0x4c); local_44 = local_44 + 1) {
    lVar4 = *(long *)(in_RSI + 0x58) + (long)local_44 * 0x60;
    uVar2 = in_EDX * *(int *)(lVar4 + 8);
    uVar3 = in_R8D * *(int *)(lVar4 + 8);
    iVar1 = *(int *)(lVar4 + 0xc);
    for (local_34 = 0; local_34 < (uint)(in_R9D * iVar1);
        local_34 = *(int *)(lVar4 + 0xc) + local_34) {
      lVar5 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                        (in_RDI,*(undefined8 *)(in_RCX + (long)local_44 * 8),local_34,
                         *(undefined4 *)(lVar4 + 0xc),1);
      for (local_4c = 0; local_4c < *(int *)(lVar4 + 0xc); local_4c = local_4c + 1) {
        local_40 = uVar3;
        if (uVar2 == 0) {
          if (uVar3 < *(uint *)(lVar4 + 0x1c)) {
            local_68 = (undefined2 *)(*(long *)(lVar5 + (long)local_4c * 8) + (ulong)uVar3 * 0x80);
            while (local_40 != 0) {
              local_60 = local_68;
              for (local_3c = *(int *)(lVar4 + 0x1c) - uVar3; local_3c != 0 && local_40 != 0;
                  local_3c = local_3c + -1) {
                local_68 = local_68 + -0x40;
                local_70 = local_60;
                local_78 = local_68;
                for (local_48 = 0; local_48 < 0x40; local_48 = local_48 + 2) {
                  psVar6 = local_70 + 1;
                  psVar7 = local_78 + 1;
                  *local_78 = *local_70;
                  local_70 = local_70 + 2;
                  local_78 = local_78 + 2;
                  *psVar7 = -*psVar6;
                }
                local_40 = local_40 - 1;
                local_60 = local_60 + 0x40;
              }
            }
          }
          else {
            memset(*(void **)(lVar5 + (long)local_4c * 8),0,(ulong)uVar3 << 7);
          }
        }
        else {
          local_68 = (undefined2 *)(*(long *)(lVar5 + (long)local_4c * 8) + (ulong)uVar2 * 0x80);
          while (local_40 != 0) {
            local_60 = local_68;
            for (local_3c = uVar2; local_3c != 0 && local_40 != 0; local_3c = local_3c - 1) {
              local_78 = local_68;
              local_60 = local_60 + -0x40;
              local_70 = local_60;
              for (local_48 = 0; local_48 < 0x40; local_48 = local_48 + 2) {
                psVar6 = local_70 + 1;
                psVar7 = local_78 + 1;
                *local_78 = *local_70;
                local_70 = local_70 + 2;
                local_78 = local_78 + 2;
                *psVar7 = -*psVar6;
              }
              local_40 = local_40 - 1;
              local_68 = local_68 + 0x40;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
do_reflect(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
           JDIMENSION x_crop_offset, jvirt_barray_ptr *src_coef_arrays,
           JDIMENSION drop_width, JDIMENSION drop_height)
/* Reflect - discard image contents of specified region, similarly to wipe,
 * but fill with repeated reflections of the outside region instead of zero.
 * NB: y_crop_offset is assumed to be zero.
 */
{
  JDIMENSION x_wipe_blocks, wipe_width;
  JDIMENSION y_wipe_blocks, wipe_bottom;
  JDIMENSION src_blk_x, dst_blk_x;
  int ci, k, offset_y;
  JBLOCKARRAY buffer;
  JBLOCKROW src_row_ptr, dst_row_ptr;
  JCOEFPTR src_ptr, dst_ptr;
  jpeg_component_info *compptr;

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    x_wipe_blocks = x_crop_offset * compptr->h_samp_factor;
    wipe_width = drop_width * compptr->h_samp_factor;
    wipe_bottom = drop_height * compptr->v_samp_factor;
    for (y_wipe_blocks = 0; y_wipe_blocks < wipe_bottom;
         y_wipe_blocks += compptr->v_samp_factor) {
      buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], y_wipe_blocks,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        if (x_wipe_blocks > 0) {
          /* Reflect from left */
          dst_row_ptr = buffer[offset_y] + x_wipe_blocks;
          for (dst_blk_x = wipe_width; dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;     /* (re)set axis of reflection */
            for (src_blk_x = x_wipe_blocks;
                 src_blk_x > 0 && dst_blk_x > 0; src_blk_x--, dst_blk_x--) {
              dst_ptr = *dst_row_ptr++;    /* destination goes right */
              src_ptr = *(--src_row_ptr);  /* source goes left */
              /* this unrolled loop doesn't need to know which row it's on... */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;   /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign change */
              }
            }
          }
        } else if (compptr->width_in_blocks > x_wipe_blocks + wipe_width) {
          /* Reflect from right */
          dst_row_ptr = buffer[offset_y] + x_wipe_blocks + wipe_width;
          for (dst_blk_x = wipe_width; dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;     /* (re)set axis of reflection */
            src_blk_x = compptr->width_in_blocks - x_wipe_blocks - wipe_width;
            for (; src_blk_x > 0 && dst_blk_x > 0; src_blk_x--, dst_blk_x--) {
              dst_ptr = *(--dst_row_ptr);  /* destination goes left */
              src_ptr = *src_row_ptr++;    /* source goes right */
              /* this unrolled loop doesn't need to know which row it's on... */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;   /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign change */
              }
            }
          }
        } else {
          MEMZERO(buffer[offset_y] + x_wipe_blocks,
                  wipe_width * sizeof(JBLOCK));
        }
      }
    }
  }
}